

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int encodeURI_hex(StringBuffer *b,int c)

{
  uint uVar1;
  undefined3 uVar2;
  int iVar3;
  undefined8 in_RAX;
  uint8_t uStack_8;
  uint8_t uStack_7;
  uint8_t buf [6];
  
  buf._1_5_ = (undefined5)((ulong)in_RAX >> 0x18);
  _uStack_8 = (undefined2)in_RAX;
  buf[0] = 0x25;
  uVar2 = _uStack_8;
  if (c < 0x100) {
    uVar1 = 1;
  }
  else {
    buf[1] = 0x75;
    _uStack_8 = CONCAT13(buf[1],uVar2);
    uVar1 = 4;
  }
  buf[uVar1] = "0123456789ABCDEF"[(uint)c >> 4 & 0xf];
  buf[(ulong)uVar1 + 1] = "0123456789ABCDEF"[c & 0xf];
  string_buffer_write8(b,buf,uVar1 | 2);
  iVar3._0_1_ = uStack_8;
  iVar3._1_1_ = uStack_7;
  iVar3._2_1_ = buf[0];
  iVar3._3_1_ = buf[1];
  return iVar3;
}

Assistant:

static int encodeURI_hex(StringBuffer *b, int c) {
    uint8_t buf[6];
    int n = 0;
    const char *hex = "0123456789ABCDEF";

    buf[n++] = '%';
    if (c >= 256) {
        buf[n++] = 'u';
        buf[n++] = hex[(c >> 12) & 15];
        buf[n++] = hex[(c >>  8) & 15];
    }
    buf[n++] = hex[(c >> 4) & 15];
    buf[n++] = hex[(c >> 0) & 15];
    return string_buffer_write8(b, buf, n);
}